

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O0

void different_stl_string_pointers_are_not_equal(void)

{
  string *this;
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  int line;
  string *this_00;
  allocator local_16;
  undefined1 local_15;
  allocator local_1;
  
  this = (string *)operator_new(0x20);
  local_15 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(this,"bob",&local_1);
  local_15 = 0;
  bob_pointer_abi_cxx11_ = (string *)this;
  std::allocator<char>::~allocator((allocator<char> *)&local_1);
  psVar1 = (string *)operator_new(0x20);
  this_00 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this_00,"alice",&local_16);
  alice_pointer_abi_cxx11_ = psVar1;
  psVar1 = alice_pointer_abi_cxx11_;
  std::allocator<char>::~allocator((allocator<char> *)&local_16);
  line = (int)((ulong)psVar1 >> 0x20);
  psVar1 = bob_pointer_abi_cxx11_;
  cgreen::create_not_equal_to_string_constraint((string *)alice_pointer_abi_cxx11_,"alice_pointer");
  cgreen::assert_that_<std::__cxx11::string*>
            ((char *)this_00,line,(char *)psVar1,in_stack_ffffffffffffffa8,(Constraint *)0x11acc9);
  return;
}

Assistant:

Ensure(different_stl_string_pointers_are_not_equal) {
    bob_pointer = new std::string("bob");
    alice_pointer = new std::string("alice");

    assert_that(bob_pointer, is_not_equal_to_string(alice_pointer));
}